

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGhsMultiGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGhsMultiGenerator::ComputeObjectFilenames
          (cmLocalGhsMultiGenerator *this,
          map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *mapping,cmGeneratorTarget *gt)

{
  int iVar1;
  bool bVar2;
  string *psVar3;
  reference ppVar4;
  mapped_type_conflict1 *pmVar5;
  string local_1d8;
  bool local_1b1;
  undefined1 local_1b0 [7];
  bool keptSourceExtension;
  string local_190;
  undefined1 local_170 [8];
  string objectName;
  cmSourceFile *sf_1;
  pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *si_1;
  iterator __end1_1;
  iterator __begin1_1;
  map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1_1;
  string local_108;
  undefined1 local_e8 [8];
  string objectNameLower;
  cmSourceFile *sf;
  pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *si;
  iterator __end1;
  iterator __begin1;
  map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  counts;
  undefined1 local_40 [8];
  string dir_max;
  cmGeneratorTarget *gt_local;
  map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *mapping_local;
  cmLocalGhsMultiGenerator *this_local;
  
  dir_max.field_2._8_8_ = gt;
  std::__cxx11::string::string((string *)local_40);
  psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(&this->super_cmLocalGenerator);
  std::__cxx11::string::operator+=((string *)local_40,(string *)psVar3);
  std::__cxx11::string::operator+=((string *)local_40,"/");
  (*(this->super_cmLocalGenerator)._vptr_cmLocalGenerator[0xc])
            (&counts._M_t._M_impl.super__Rb_tree_header._M_node_count,this,dir_max.field_2._8_8_);
  std::__cxx11::string::operator+=
            ((string *)local_40,(string *)&counts._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)&counts._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::operator+=((string *)local_40,"/");
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         *)&__range1);
  __end1 = std::
           map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(mapping);
  si = (pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)std::
          map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::end(mapping);
  while( true ) {
    bVar2 = std::operator!=(&__end1,(_Self *)&si);
    if (!bVar2) break;
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*(&__end1);
    objectNameLower.field_2._8_8_ = ppVar4->first;
    psVar3 = cmSourceFile::GetFullPath_abi_cxx11_((cmSourceFile *)objectNameLower.field_2._8_8_);
    cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_108,psVar3);
    cmsys::SystemTools::LowerCase((string *)local_e8,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    cmGlobalGenerator::GetLanguageOutputExtension_abi_cxx11_
              ((string *)&__range1_1,(this->super_cmLocalGenerator).GlobalGenerator,
               (cmSourceFile *)objectNameLower.field_2._8_8_);
    std::__cxx11::string::operator+=((string *)local_e8,(string *)&__range1_1);
    std::__cxx11::string::~string((string *)&__range1_1);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           *)&__range1,(key_type *)local_e8);
    *pmVar5 = *pmVar5 + 1;
    std::__cxx11::string::~string((string *)local_e8);
    std::
    _Rb_tree_iterator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::
             map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin(mapping);
  si_1 = (pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)std::
            map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::end(mapping);
  while( true ) {
    bVar2 = std::operator!=(&__end1_1,(_Self *)&si_1);
    if (!bVar2) break;
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*(&__end1_1);
    objectName.field_2._8_8_ = ppVar4->first;
    psVar3 = cmSourceFile::GetFullPath_abi_cxx11_((cmSourceFile *)objectName.field_2._8_8_);
    cmsys::SystemTools::GetFilenameWithoutLastExtension((string *)local_170,psVar3);
    cmGlobalGenerator::GetLanguageOutputExtension_abi_cxx11_
              (&local_190,(this->super_cmLocalGenerator).GlobalGenerator,
               (cmSourceFile *)objectName.field_2._8_8_);
    std::__cxx11::string::operator+=((string *)local_170,(string *)&local_190);
    std::__cxx11::string::~string((string *)&local_190);
    cmsys::SystemTools::LowerCase((string *)local_1b0,(string *)local_170);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           *)&__range1,(key_type *)local_1b0);
    iVar1 = *pmVar5;
    std::__cxx11::string::~string((string *)local_1b0);
    if (1 < iVar1) {
      cmGeneratorTarget::AddExplicitObjectName
                ((cmGeneratorTarget *)dir_max.field_2._8_8_,(cmSourceFile *)objectName.field_2._8_8_
                );
      cmLocalGenerator::GetObjectFileNameWithoutTarget
                (&local_1d8,&this->super_cmLocalGenerator,(cmSourceFile *)objectName.field_2._8_8_,
                 (string *)local_40,&local_1b1,(char *)0x0);
      std::__cxx11::string::operator=((string *)local_170,(string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
      cmsys::SystemTools::ReplaceString((string *)local_170,"/","_");
    }
    std::__cxx11::string::operator=((string *)&ppVar4->second,(string *)local_170);
    std::__cxx11::string::~string((string *)local_170);
    std::
    _Rb_tree_iterator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end1_1);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *)&__range1);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void cmLocalGhsMultiGenerator::ComputeObjectFilenames(
  std::map<cmSourceFile const*, std::string>& mapping,
  cmGeneratorTarget const* gt)
{
  std::string dir_max;
  dir_max += this->GetCurrentBinaryDirectory();
  dir_max += "/";
  dir_max += this->GetTargetDirectory(gt);
  dir_max += "/";

  // Count the number of object files with each name.  Note that
  // filesystem may not be case sensitive.
  std::map<std::string, int> counts;

  for (auto const& si : mapping) {
    cmSourceFile const* sf = si.first;
    std::string objectNameLower = cmSystemTools::LowerCase(
      cmSystemTools::GetFilenameWithoutLastExtension(sf->GetFullPath()));
    objectNameLower += this->GlobalGenerator->GetLanguageOutputExtension(*sf);
    counts[objectNameLower] += 1;
  }

  // For all source files producing duplicate names we need unique
  // object name computation.
  for (auto& si : mapping) {
    cmSourceFile const* sf = si.first;
    std::string objectName =
      cmSystemTools::GetFilenameWithoutLastExtension(sf->GetFullPath());
    objectName += this->GlobalGenerator->GetLanguageOutputExtension(*sf);

    if (counts[cmSystemTools::LowerCase(objectName)] > 1) {
      const_cast<cmGeneratorTarget*>(gt)->AddExplicitObjectName(sf);
      bool keptSourceExtension;
      objectName = this->GetObjectFileNameWithoutTarget(*sf, dir_max,
                                                        &keptSourceExtension);
      cmsys::SystemTools::ReplaceString(objectName, "/", "_");
    }
    si.second = objectName;
  }
}